

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O2

QRectF * __thiscall
QTextDocumentLayoutPrivate::frameBoundingRectInternal
          (QRectF *__return_storage_ptr__,QTextDocumentLayoutPrivate *this,QTextFrame *frame)

{
  QTextTableData *this_00;
  QTextTable *table;
  QFixedPoint QVar1;
  QObject *object;
  QTextFrameData *pQVar2;
  long in_FS_OFFSET;
  QPointF QVar3;
  QSizeF QVar4;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QTextFrame::firstPosition(frame);
  local_68 = 0.0;
  uStack_60 = 0.0;
  for (object = (QObject *)frame; object != (QObject *)0x0;
      object = (QObject *)QTextFrame::parentFrame((QTextFrame *)object)) {
    this_00 = (QTextTableData *)::data((QTextFrame *)object);
    QVar3 = QFixedPoint::toPointF(&(this_00->super_QTextFrameData).position);
    local_68 = local_68 + QVar3.xp;
    uStack_60 = uStack_60 + QVar3.yp;
    table = QtPrivate::qobject_cast_helper<QTextTable*,QObject>(object);
    if (table != (QTextTable *)0x0) {
      local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextTable::cellAt((QTextTable *)local_48,(int)table);
      if ((QTextTable *)local_48._0_8_ != (QTextTable *)0x0) {
        QVar1 = QTextTableData::cellPosition(this_00,table,(QTextTableCell *)local_48);
        local_68 = local_68 + (double)QVar1.x.val.val * 0.015625;
        uStack_60 = uStack_60 + (double)QVar1.y.val.val * 0.015625;
      }
    }
  }
  pQVar2 = ::data(frame);
  QVar4 = QFixedSize::toSizeF(&pQVar2->size);
  *(undefined4 *)&__return_storage_ptr__->xp = (undefined4)local_68;
  *(undefined4 *)((long)&__return_storage_ptr__->xp + 4) = local_68._4_4_;
  *(undefined4 *)&__return_storage_ptr__->yp = (undefined4)uStack_60;
  *(undefined4 *)((long)&__return_storage_ptr__->yp + 4) = uStack_60._4_4_;
  __return_storage_ptr__->w = QVar4.wd;
  __return_storage_ptr__->h = QVar4.ht;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QRectF QTextDocumentLayoutPrivate::frameBoundingRectInternal(QTextFrame *frame) const
{
    QPointF pos;
    const int framePos = frame->firstPosition();
    QTextFrame *f = frame;
    while (f) {
        QTextFrameData *fd = data(f);
        pos += fd->position.toPointF();

        if (QTextTable *table = qobject_cast<QTextTable *>(f)) {
            QTextTableCell cell = table->cellAt(framePos);
            if (cell.isValid())
                pos += static_cast<QTextTableData *>(fd)->cellPosition(table, cell).toPointF();
        }

        f = f->parentFrame();
    }
    return QRectF(pos, data(frame)->size.toSizeF());
}